

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread-workload-benchmark.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char *__s;
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  ostream *poVar6;
  size_t sVar7;
  uint uVar8;
  thread *t;
  ulong uVar9;
  pointer ptVar10;
  code *__f;
  thread *t_00;
  int iVar11;
  long lVar12;
  long lVar13;
  WorkloadFunc func;
  string workload_name;
  vector<float,_std::allocator<float>_> results;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  inputs;
  int local_f0;
  _Any_data local_e8;
  code *local_d8;
  undefined8 uStack_d0;
  char **local_c8;
  thread local_c0;
  long *local_b8;
  long local_b0;
  long local_a8 [2];
  vector<float,_std::allocator<float>_> local_98;
  pointer local_80;
  reference_wrapper<float> local_78;
  reference_wrapper<const_std::vector<float,_std::allocator<float>_>_> local_70;
  vector<std::thread,_std::allocator<std::thread>_> local_68;
  locale local_50 [8];
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  local_48;
  
  local_c8 = argv;
  std::locale::locale((locale *)local_e8._M_pod_data,"");
  std::ios::imbue(local_50);
  std::locale::~locale(local_50);
  std::locale::~locale((locale *)local_e8._M_pod_data);
  uVar8 = argc / 2;
  std::vector<float,_std::allocator<float>_>::vector
            (&local_98,(long)(int)uVar8,(allocator_type *)local_e8._M_pod_data);
  local_80 = local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
  std::vector<std::thread,_std::allocator<std::thread>_>::vector
            (&local_68,(long)(int)uVar8,(allocator_type *)local_e8._M_pod_data);
  lVar5 = std::chrono::_V2::system_clock::now();
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::vector(&local_48,(long)(int)(uVar8 + 1),(allocator_type *)local_e8._M_pod_data);
  if (1 < argc) {
    uVar9 = (ulong)uVar8;
    lVar12 = 0;
    do {
      make_input_array((vector<float,_std::allocator<float>_> *)&local_e8,100000000);
      std::vector<float,_std::allocator<float>_>::_M_move_assign
                ((vector<float,_std::allocator<float>_> *)
                 ((long)&((local_48.
                           super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                         super__Vector_impl_data._M_start + lVar12),&local_e8);
      if (local_e8._M_unused._M_object != (void *)0x0) {
        operator_delete(local_e8._M_unused._M_object,(long)local_d8 - local_e8._0_8_);
      }
      lVar12 = lVar12 + 0x18;
      uVar9 = uVar9 - 1;
    } while (uVar9 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Created ",8);
  poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,uVar8 + 1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," input arrays",0xd);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"; elapsed: ",0xb);
  lVar12 = std::chrono::_V2::system_clock::now();
  poVar6 = std::ostream::_M_insert<double>((double)(lVar12 - lVar5) / 1000000.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," ms\n",4);
  bVar1 = 1 < argc;
  if (argc < 2) {
    local_f0 = 0;
  }
  else {
    lVar12 = 0;
    lVar13 = 0;
    lVar5 = 0;
    local_f0 = 0;
    iVar11 = 2;
    do {
      local_d8 = (code *)0x0;
      uStack_d0 = 0;
      local_e8._M_unused._M_object = (void *)0x0;
      local_e8._8_8_ = 0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,*(char **)((long)local_c8 + lVar5 * 2 + 8),
                 (allocator<char> *)&local_c0);
      iVar3 = std::__cxx11::string::compare((char *)&local_b8);
      __f = workload_fpchurn;
      if (iVar3 == 0) {
LAB_001034c5:
        std::function<void(std::vector<float,std::allocator<float>>const&,float&)>::operator=
                  ((function<void(std::vector<float,std::allocator<float>>const&,float&)> *)
                   local_e8._M_pod_data,__f);
        iVar3 = 0;
        if (iVar11 < argc) {
          iVar3 = atoi(*(char **)((long)local_c8 + lVar5 * 2 + 0x10));
        }
        iVar4 = pthread_mutex_lock((pthread_mutex_t *)&iomutex);
        if (iVar4 != 0) {
          std::__throw_system_error(iVar4);
LAB_0010370b:
          std::terminate();
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Spawning workload \'",0x13);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(char *)local_b8,local_b0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\' on CPU ",9);
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
        pthread_mutex_unlock((pthread_mutex_t *)&iomutex);
        local_70._M_data =
             (vector<float,_std::allocator<float>_> *)
             ((long)&((local_48.
                       super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->
                     super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                     super__Vector_impl_data._M_start + lVar13);
        local_78._M_data =
             (float *)((long)local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_start + lVar12);
        std::thread::
        thread<std::function<void(std::vector<float,std::allocator<float>>const&,float&)>&,std::reference_wrapper<std::vector<float,std::allocator<float>>const>,std::reference_wrapper<float>,void>
                  (&local_c0,
                   (function<void_(const_std::vector<float,_std::allocator<float>_>_&,_float_&)> *)
                   &local_e8,&local_70,&local_78);
        if (*(long *)((long)&((local_68.
                               super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl
                               .super__Vector_impl_data._M_start)->_M_id)._M_thread + lVar5) != 0)
        goto LAB_0010370b;
        t_00 = (thread *)
               ((long)&((local_68.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                         _M_impl.super__Vector_impl_data._M_start)->_M_id)._M_thread + lVar5);
        (t_00->_M_id)._M_thread = (native_handle_type)local_c0._M_id._M_thread;
        bVar2 = true;
        pin_thread_to_cpu(t_00,iVar3);
      }
      else {
        iVar3 = std::__cxx11::string::compare((char *)&local_b8);
        __f = workload_sin;
        if (iVar3 == 0) goto LAB_001034c5;
        iVar3 = std::__cxx11::string::compare((char *)&local_b8);
        __f = workload_accum;
        if (iVar3 == 0) goto LAB_001034c5;
        iVar3 = std::__cxx11::string::compare((char *)&local_b8);
        __f = workload_unrollaccum4;
        if (iVar3 == 0) goto LAB_001034c5;
        iVar3 = std::__cxx11::string::compare((char *)&local_b8);
        __f = workload_unrollaccum8;
        if (iVar3 == 0) goto LAB_001034c5;
        iVar3 = std::__cxx11::string::compare((char *)&local_b8);
        __f = workload_stdaccum;
        if (iVar3 == 0) goto LAB_001034c5;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"unknown workload: ",0x12);
        __s = *(char **)((long)local_c8 + lVar5 * 2 + 8);
        if (__s == (char *)0x0) {
          std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x1081b8);
        }
        else {
          sVar7 = strlen(__s);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,__s,sVar7);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
        local_f0 = 1;
        bVar2 = false;
      }
      if (local_b8 != local_a8) {
        operator_delete(local_b8,local_a8[0] + 1);
      }
      if (local_d8 != (code *)0x0) {
        (*local_d8)(&local_e8,&local_e8,3);
      }
      if (!bVar2) break;
      lVar5 = lVar5 + 8;
      lVar13 = lVar13 + 0x18;
      lVar12 = lVar12 + 4;
      iVar3 = iVar11 + 1;
      bVar1 = iVar3 < argc;
      iVar11 = iVar11 + 2;
    } while (iVar3 < argc);
  }
  if (!bVar1) {
    local_f0 = 0;
    for (ptVar10 = local_68.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                   super__Vector_impl_data._M_start;
        ptVar10 !=
        local_68.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_finish; ptVar10 = ptVar10 + 1) {
      std::thread::join();
    }
  }
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::~vector(&local_48);
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&local_68);
  if (local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return local_f0;
}

Assistant:

int main(int argc, const char** argv) {
  // Set locale for comma-separation in large numbers.
  std::cout.imbue(std::locale(""));

  // Command-line invocation:
  //
  //  argv[0] is the program name
  //  argv[1] is workload name, with cpu number at argv[2]
  //  argv[3] is workload name, with cpu number at argv[4]
  //  ... etc.

  int num_workloads = argc / 2;
  std::vector<float> results(num_workloads);
  do_not_optimize(results.data());
  std::vector<std::thread> threads(num_workloads);

  constexpr size_t INPUT_SIZE = 100 * 1000 * 1000;
  auto t1 = hires_clock::now();

  // Allocate and initialize one extra input array - not used by any workload.
  // This makes sure none of the actual working inputs stays in L3 cache (which
  // is fairly sizable), giving one of the workloads an unfair advantage. The
  // lower cache layers are so small compared to the input size that their
  // pre-seeding advantage is negligible.
  std::vector<std::vector<float>> inputs(num_workloads + 1);
  for (int i = 0; i < num_workloads; ++i) {
    inputs[i] = make_input_array(INPUT_SIZE);
  }
  std::cout << "Created " << num_workloads + 1 << " input arrays"
            << "; elapsed: " << duration_ms(hires_clock::now() - t1).count()
            << " ms\n";

  for (int i = 1; i < argc; i += 2) {
    WorkloadFunc func;
    std::string workload_name = argv[i];
    if (workload_name == "fpchurn") {
      func = workload_fpchurn;
    } else if (workload_name == "sin") {
      func = workload_sin;
    } else if (workload_name == "accum") {
      func = workload_accum;
    } else if (workload_name == "unrollaccum4") {
      func = workload_unrollaccum4;
    } else if (workload_name == "unrollaccum8") {
      func = workload_unrollaccum8;
    } else if (workload_name == "stdaccum") {
      func = workload_stdaccum;
    } else {
      std::cerr << "unknown workload: " << argv[i] << "\n";
      return 1;
    }

    int cpu_num;
    if (i + 1 >= argc) {
      cpu_num = 0;
    } else {
      cpu_num = std::atoi(argv[i + 1]);
    }

    {
      std::lock_guard<std::mutex> iolock(iomutex);
      std::cout << "Spawning workload '" << workload_name << "' on CPU "
                << cpu_num << "\n";
    }

    int nworkload = i / 2;
    threads[nworkload] = std::thread(func, std::cref(inputs[nworkload]),
                                     std::ref(results[nworkload]));
    pin_thread_to_cpu(threads[nworkload], cpu_num);
  }

  // All the threads were launched in parallel in the loop above. Now wait for
  // all of them to finish.
  for (auto& t : threads) {
    t.join();
  }
  return 0;
}